

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void libcellml::fixComponentUnits(ModelPtr *model,ComponentPtr *component)

{
  string *name;
  _Alloc_hider _Var1;
  size_t sVar2;
  ulong uVar3;
  VariablePtr variable;
  UnitsPtr units;
  string local_80;
  Component local_60;
  
  sVar2 = Component::variableCount
                    ((component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (sVar2 != 0) {
    uVar3 = 0;
    do {
      Component::variable(&local_60,
                          (size_t)(component->
                                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr);
      Variable::units((Variable *)
                      local_60.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                      super_Entity._vptr_Entity);
      _Var1._M_p = local_80._M_dataplus._M_p;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length);
      }
      if (_Var1._M_p != (pointer)0x0) {
        name = (string *)
               (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        Variable::units((Variable *)
                        local_60.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                        super_Entity._vptr_Entity);
        NamedEntity::name_abi_cxx11_
                  (&local_80,(NamedEntity *)local_60.super_ImportedEntity._vptr_ImportedEntity);
        Model::units((Model *)&local_60.super_enable_shared_from_this<libcellml::Component>,name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if (local_60.super_ImportedEntity.mPimpl != (ImportedEntityImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_60.super_ImportedEntity.mPimpl);
        }
        if (local_60.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
            super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          Variable::setUnits((Variable *)
                             local_60.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                             super_Entity._vptr_Entity,
                             (UnitsPtr *)
                             &local_60.super_enable_shared_from_this<libcellml::Component>);
        }
        if (local_60.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
            super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_60.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
                     super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_60.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_60.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                   super_Entity.mPimpl);
      }
      uVar3 = uVar3 + 1;
      sVar2 = Component::variableCount
                        ((component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
    } while (uVar3 < sVar2);
  }
  sVar2 = ComponentEntity::componentCount
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ComponentEntity);
  if (sVar2 != 0) {
    uVar3 = 0;
    do {
      ComponentEntity::component
                ((ComponentEntity *)&local_80,
                 (size_t)(component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      fixComponentUnits(model,(ComponentPtr *)&local_80);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length);
      }
      uVar3 = uVar3 + 1;
      sVar2 = ComponentEntity::componentCount
                        (&((component->
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->super_ComponentEntity);
    } while (uVar3 < sVar2);
  }
  return;
}

Assistant:

void fixComponentUnits(const ModelPtr &model, const ComponentPtr &component)
{
    for (size_t v = 0; v < component->variableCount(); ++v) {
        auto variable = component->variable(v);
        if (variable->units() != nullptr) {
            // Find the units in the model and switch out.
            auto units = model->units(variable->units()->name());
            if (units != nullptr) {
                variable->setUnits(units);
            }
        }
    }
    for (size_t c = 0; c < component->componentCount(); ++c) {
        fixComponentUnits(model, component->component(c));
    }
}